

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtablewidget.cpp
# Opt level: O0

void QTableWidget::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  bool bVar1;
  int iVar2;
  QTableWidgetItem *item;
  QtMocHelpers *in_RCX;
  ScrollHint in_EDX;
  int in_ESI;
  void *_v_1;
  void *_v;
  QTableWidget *_t;
  int in_stack_fffffffffffffec8;
  int in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffed0;
  ScrollHint in_stack_fffffffffffffed4;
  QTableWidget *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  int *piVar3;
  QTableWidget *in_stack_fffffffffffffef0;
  
  if (in_ESI == 0) {
    item = (QTableWidgetItem *)(ulong)in_EDX;
    iVar2 = (int)((ulong)in_stack_fffffffffffffee8 >> 0x20);
    switch(item) {
    case (QTableWidgetItem *)0x0:
      itemPressed((QTableWidget *)0x8dd23f,
                  (QTableWidgetItem *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      break;
    case (QTableWidgetItem *)0x1:
      itemClicked((QTableWidget *)0x8dd260,
                  (QTableWidgetItem *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      break;
    case (QTableWidgetItem *)0x2:
      itemDoubleClicked((QTableWidget *)0x8dd281,
                        (QTableWidgetItem *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case (QTableWidgetItem *)0x3:
      itemActivated((QTableWidget *)0x8dd2a2,
                    (QTableWidgetItem *)
                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
      break;
    case (QTableWidgetItem *)0x4:
      itemEntered((QTableWidget *)0x8dd2c3,
                  (QTableWidgetItem *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      break;
    case (QTableWidgetItem *)0x5:
      itemChanged((QTableWidget *)0x8dd2e4,
                  (QTableWidgetItem *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8))
      ;
      break;
    case (QTableWidgetItem *)0x6:
      currentItemChanged((QTableWidget *)
                         CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),item,
                         (QTableWidgetItem *)
                         CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      break;
    case (QTableWidgetItem *)0x7:
      itemSelectionChanged((QTableWidget *)0x8dd326);
      break;
    case (QTableWidgetItem *)0x8:
      cellPressed((QTableWidget *)0x8dd354,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      break;
    case (QTableWidgetItem *)0x9:
      cellClicked((QTableWidget *)0x8dd382,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      break;
    case (QTableWidgetItem *)0xa:
      cellDoubleClicked((QTableWidget *)0x8dd3b0,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8
                       );
      break;
    case (QTableWidgetItem *)0xb:
      cellActivated((QTableWidget *)0x8dd3de,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      break;
    case (QTableWidgetItem *)0xc:
      cellEntered((QTableWidget *)0x8dd40c,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      break;
    case (QTableWidgetItem *)0xd:
      cellChanged((QTableWidget *)0x8dd43a,in_stack_fffffffffffffecc,in_stack_fffffffffffffec8);
      break;
    case (QTableWidgetItem *)0xe:
      currentCellChanged((QTableWidget *)item,iVar2,(int)in_stack_fffffffffffffee8,
                         (int)((ulong)in_stack_fffffffffffffee0 >> 0x20),
                         (int)in_stack_fffffffffffffee0);
      break;
    case (QTableWidgetItem *)0xf:
      scrollToItem(in_stack_fffffffffffffee0,item,in_stack_fffffffffffffed4);
      break;
    case (QTableWidgetItem *)0x10:
      scrollToItem(in_stack_fffffffffffffee0,item,in_stack_fffffffffffffed4);
      break;
    case (QTableWidgetItem *)0x11:
      insertRow(in_stack_fffffffffffffef0,iVar2);
      break;
    case (QTableWidgetItem *)0x12:
      insertColumn(in_stack_fffffffffffffef0,iVar2);
      break;
    case (QTableWidgetItem *)0x13:
      removeRow(in_stack_fffffffffffffef0,iVar2);
      break;
    case (QTableWidgetItem *)0x14:
      removeColumn(in_stack_fffffffffffffef0,iVar2);
      break;
    case (QTableWidgetItem *)0x15:
      clear((QTableWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
      break;
    case (QTableWidgetItem *)0x16:
      clearContents((QTableWidget *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0));
    }
  }
  if ((in_ESI != 5) ||
     (((((bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                            (in_RCX,(void **)itemPressed,0,0), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                            (in_RCX,(void **)itemClicked,0,1), !bVar1)) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                           (in_RCX,(void **)itemDoubleClicked,0,2), !bVar1)) &&
       (((bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                            (in_RCX,(void **)itemActivated,0,3), !bVar1 &&
         (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                            (in_RCX,(void **)itemEntered,0,4), !bVar1)) &&
        ((bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*)>
                            (in_RCX,(void **)itemChanged,0,5), !bVar1 &&
         ((bVar1 = QtMocHelpers::
                   indexOfMethod<void(QTableWidget::*)(QTableWidgetItem*,QTableWidgetItem*)>
                             (in_RCX,(void **)currentItemChanged,0,6), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)()>
                             (in_RCX,(void **)itemSelectionChanged,0,7), !bVar1)))))))) &&
      ((bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                          (in_RCX,(void **)cellPressed,0,8), !bVar1 &&
       (((((bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                              (in_RCX,(void **)cellClicked,0,9), !bVar1 &&
           (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                              (in_RCX,(void **)cellDoubleClicked,0,10), !bVar1)) &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                             (in_RCX,(void **)cellActivated,0,0xb), !bVar1)) &&
         ((bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                             (in_RCX,(void **)cellEntered,0,0xc), !bVar1 &&
          (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int)>
                             (in_RCX,(void **)cellChanged,0,0xd), !bVar1)))) &&
        (bVar1 = QtMocHelpers::indexOfMethod<void(QTableWidget::*)(int,int,int,int)>
                           (in_RCX,(void **)currentCellChanged,0,0xe), !bVar1)))))))) {
    if (in_ESI == 1) {
      piVar3 = *(int **)in_RCX;
      in_stack_fffffffffffffed4 = in_EDX;
      if (in_EDX == EnsureVisible) {
        iVar2 = rowCount(in_stack_fffffffffffffee0);
        *piVar3 = iVar2;
      }
      else if (in_EDX == PositionAtTop) {
        iVar2 = columnCount(in_stack_fffffffffffffee0);
        *piVar3 = iVar2;
      }
    }
    if (in_ESI == 2) {
      if (in_EDX == EnsureVisible) {
        setRowCount((QTableWidget *)((ulong)in_stack_fffffffffffffed4 << 0x20),
                    in_stack_fffffffffffffecc);
      }
      else if (in_EDX == PositionAtTop) {
        setColumnCount((QTableWidget *)CONCAT44(in_stack_fffffffffffffed4,1),
                       in_stack_fffffffffffffecc);
      }
    }
  }
  return;
}

Assistant:

void QTableWidget::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTableWidget *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->itemPressed((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 1: _t->itemClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 2: _t->itemDoubleClicked((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 3: _t->itemActivated((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 4: _t->itemEntered((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 5: _t->itemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1]))); break;
        case 6: _t->currentItemChanged((*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QTableWidgetItem*>>(_a[2]))); break;
        case 7: _t->itemSelectionChanged(); break;
        case 8: _t->cellPressed((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 9: _t->cellClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->cellDoubleClicked((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 11: _t->cellActivated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 12: _t->cellEntered((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 13: _t->cellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 14: _t->currentCellChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[4]))); break;
        case 15: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemView::ScrollHint>>(_a[2]))); break;
        case 16: _t->scrollToItem((*reinterpret_cast< std::add_pointer_t<const QTableWidgetItem*>>(_a[1]))); break;
        case 17: _t->insertRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 18: _t->insertColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 19: _t->removeRow((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 20: _t->removeColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 21: _t->clear(); break;
        case 22: _t->clearContents(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemPressed, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemClicked, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemDoubleClicked, 2))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemActivated, 3))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemEntered, 4))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * )>(_a, &QTableWidget::itemChanged, 5))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(QTableWidgetItem * , QTableWidgetItem * )>(_a, &QTableWidget::currentItemChanged, 6))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)()>(_a, &QTableWidget::itemSelectionChanged, 7))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellPressed, 8))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellClicked, 9))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellDoubleClicked, 10))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellActivated, 11))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellEntered, 12))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int )>(_a, &QTableWidget::cellChanged, 13))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTableWidget::*)(int , int , int , int )>(_a, &QTableWidget::currentCellChanged, 14))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->rowCount(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->columnCount(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setRowCount(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setColumnCount(*reinterpret_cast<int*>(_v)); break;
        default: break;
        }
    }
}